

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<double>
          (ParserRefImpl<Catch::clara::detail::Opt> *this,double *ref,string *hint)

{
  shared_ptr<Catch::clara::detail::BoundValueRef<double>_> local_30;
  string *local_20;
  string *hint_local;
  double *ref_local;
  ParserRefImpl<Catch::clara::detail::Opt> *this_local;
  
  local_20 = hint;
  hint_local = (string *)ref;
  ref_local = (double *)this;
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::clara::detail::Opt>);
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00406a38;
  this->m_optionality = Optional;
  ::std::make_shared<Catch::clara::detail::BoundValueRef<double>,double&>((double *)&local_30);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundValueRef<double>,void>(&this->m_ref,&local_30);
  std::shared_ptr<Catch::clara::detail::BoundValueRef<double>_>::~shared_ptr(&local_30);
  ::std::__cxx11::string::string((string *)&this->m_hint,(string *)local_20);
  ::std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}